

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O3

MVOverEl<double> * __thiscall
mp::pre::ValuePresolver::PresolveSolution
          (MVOverEl<double> *__return_storage_ptr__,ValuePresolver *this,MVOverEl<double> *mv,
          ValueResolution param_2)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  double dVar9;
  
  ValuePresolverImpl::
  RunPresolve<mp::pre::ModelValues<mp::pre::ValueMap<std::vector<double,std::allocator<double>>,int>>>
            (__return_storage_ptr__,&this->super_ValuePresolverImpl,0x39,
             (ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_> *)
             0x0,(ValueResolution)mv);
  pvVar7 = ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
                     (&__return_storage_ptr__->vars_);
  iVar5 = (*this->model_->_vptr_BasicFlatModel[2])();
  iVar6 = (*this->model_->_vptr_BasicFlatModel[3])();
  pdVar1 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar2 = *(long *)CONCAT44(extraout_var,iVar5);
    lVar3 = *(long *)CONCAT44(extraout_var_00,iVar6);
    do {
      lVar4 = lVar8 + -1;
      dVar9 = *(double *)(lVar2 + -8 + lVar8 * 8);
      lVar8 = lVar8 + -1;
      if ((pdVar1[lVar4] < dVar9) || (dVar9 = *(double *)(lVar3 + lVar8 * 8), dVar9 < pdVar1[lVar4])
         ) {
        pdVar1[lVar8] = dVar9;
      }
    } while (lVar8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

MVOverEl<double> PresolveSolution (
      const MVOverEl<double>& mv,
      ValueResolution  = ValueResolution::ValResLast) override {
    auto result = ValuePresolverImpl::PresolveSolution(
        mv, ValueResolution::ValResLast);
    auto& x = result.GetVarValues()();
    const auto& lbs = model_.GetVarLBs();
    const auto& ubs = model_.GetVarUBs();
    assert(x.size() == lbs.size());
    assert(lbs.size() == ubs.size());
    for (auto i=x.size(); i--; ) {
      if (x[i]<lbs[i])
        x[i]=lbs[i];
      else
        if (x[i]>ubs[i])
          x[i]=ubs[i];
    }
    return result;
  }